

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prevector.h
# Opt level: O2

void __thiscall
prevector<8U,_int,_unsigned_int,_int>::resize_uninitialized
          (prevector<8U,_int,_unsigned_int,_int> *this,size_type new_size)

{
  long lVar1;
  uint uVar2;
  uint uVar3;
  prevector<8U,_int,_unsigned_int,_int> *ppVar4;
  long in_FS_OFFSET;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  uVar2 = this->_size;
  if (uVar2 < 9) {
    uVar3 = 8;
  }
  else {
    uVar3 = (this->_union).indirect_contents.capacity;
  }
  if (uVar3 < new_size) {
    change_capacity(this,new_size);
    uVar2 = this->_size;
    uVar3 = uVar2 - 9;
    if (uVar2 < 9) {
      uVar3 = uVar2;
    }
  }
  else {
    uVar3 = uVar2 - 9;
    if (uVar2 < 9) {
      uVar3 = uVar2;
    }
    if (new_size < uVar3) {
      ppVar4 = this;
      if (8 < uVar2) {
        ppVar4 = (prevector<8U,_int,_unsigned_int,_int> *)(this->_union).indirect_contents.indirect;
      }
      if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
        erase(this,(int *)((long)&ppVar4->_union + (long)(int)new_size * 4),
              (int *)((long)&ppVar4->_union + (long)(int)uVar3 * 4));
        return;
      }
      goto LAB_0044a13b;
    }
  }
  this->_size = (uVar2 + new_size) - uVar3;
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
LAB_0044a13b:
  __stack_chk_fail();
}

Assistant:

inline void resize_uninitialized(size_type new_size) {
        // resize_uninitialized changes the size of the prevector but does not initialize it.
        // If size < new_size, the added elements must be initialized explicitly.
        if (capacity() < new_size) {
            change_capacity(new_size);
            _size += new_size - size();
            return;
        }
        if (new_size < size()) {
            erase(item_ptr(new_size), end());
        } else {
            _size += new_size - size();
        }
    }